

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O3

void __thiscall tonk::UDPSocket::CloseSocket(UDPSocket *this)

{
  ostringstream *this_00;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar1;
  Channel *pCVar2;
  OutputWorker *this_01;
  error_code error;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  int local_1b0;
  long *local_1a8;
  undefined1 local_1a0 [392];
  
  LOCK();
  (this->SocketClosed)._M_base._M_i = true;
  UNLOCK();
  pbVar1 = (this->Socket)._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  if (pbVar1 != (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                 *)0x0) {
    local_1b0 = 0;
    local_1a8 = (long *)std::_V2::system_category();
    asio::datagram_socket_service<asio::ip::udp>::close
              ((pbVar1->
               super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
               super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_,
               (int)pbVar1 + 8);
    if (local_1b0 != 0) {
      pCVar2 = (this->Deps).Logger;
      (**(code **)(*local_1a8 + 0x20))(&local_1d0);
      if ((int)pCVar2->ChannelMinLevel < 4) {
        local_1a0._0_8_ = pCVar2->ChannelName;
        this_00 = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(pCVar2->Prefix)._M_dataplus._M_p,
                   (pCVar2->Prefix)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Failure while destroying UDP socket: ",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_1d0,local_1c8);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
    }
  }
  return;
}

Assistant:

void UDPSocket::CloseSocket()
{
    SocketClosed = true;

    if (Socket)
    {
        asio::error_code error;
        Socket->close(error);

        if (error) {
            Deps.Logger->Warning("Failure while destroying UDP socket: ", error.message());
        }
    }
}